

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderView::mouseMoveEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  long lVar2;
  QHeaderViewPrivate *this_00;
  QAbstractItemModel *pQVar3;
  QObject *pQVar4;
  QWidgetData *pQVar5;
  qsizetype qVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ResizeMode RVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  QPoint QVar14;
  QPoint QVar15;
  int iVar16;
  Representation position;
  long in_FS_OFFSET;
  QPointF QVar17;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QStatusTipEvent tip;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  QVar17 = QSinglePointEvent::position((QSinglePointEvent *)e);
  _tip = (undefined1 *)QVar17.xp;
  if (OVar1 == Horizontal) {
    QVar14 = QPointF::toPoint((QPointF *)&tip);
    position = QVar14.xp.m_i;
  }
  else {
    QVar14 = QPointF::toPoint((QPointF *)&tip);
    position = QVar14.yp.m_i;
  }
  if ((position.m_i < 0) && (this_00->state != SelectSections)) goto switchD_004faad0_default;
  if (*(int *)(e + 0x44) != 0) {
    switch(this_00->state) {
    case NoState:
      goto switchD_004faad0_caseD_0;
    case ResizeSection:
      bVar8 = this_00->cascadingResizing;
      bVar7 = QHeaderViewPrivate::reverse(this_00);
      if (bVar8 == true) {
        iVar9 = this_00->lastPos - position.m_i;
        if (!bVar7) {
          iVar9 = position.m_i - this_00->lastPos;
        }
        iVar11 = visualIndex(this,this_00->section);
        iVar16 = QHeaderViewPrivate::headerSectionSize(this_00,iVar11);
        QHeaderViewPrivate::cascadingResize(this_00,iVar11,iVar9 + iVar16);
      }
      else {
        iVar9 = this_00->firstPos - position.m_i;
        if (!bVar7) {
          iVar9 = position.m_i - this_00->firstPos;
        }
        iVar12 = minimumSectionSize(this);
        iVar9 = iVar9 + this_00->originalSize;
        iVar11 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x608);
        iVar16 = 0xfffff;
        if (iVar11 != -1) {
          iVar16 = iVar11;
        }
        if (iVar9 <= iVar16) {
          iVar16 = iVar9;
        }
        if (iVar16 <= iVar12) {
          iVar16 = iVar12;
        }
        resizeSection(this,this_00->section,iVar16);
      }
      this_00->lastPos = position.m_i;
      break;
    case MoveSection:
      QVar17 = QSinglePointEvent::position((QSinglePointEvent *)e);
      _tip = (undefined1 *)QVar17.xp;
      local_88.d = (Data *)QPointF::toPoint((QPointF *)&tip);
      bVar8 = QAbstractItemViewPrivate::shouldAutoScroll
                        (&this_00->super_QAbstractItemViewPrivate,(QPoint *)&local_88);
      if (bVar8) {
        QVar14 = QMouseEvent::pos(e);
        QVar15 = QAbstractItemViewPrivate::offset(&this_00->super_QAbstractItemViewPrivate);
        (this_00->super_QAbstractItemViewPrivate).draggedPosition =
             (QPoint)((ulong)(uint)(QVar15.xp.m_i.m_i + QVar14.xp.m_i.m_i) |
                     ((ulong)QVar15 & 0xffffffff00000000) + (long)QVar14 & 0xffffffff00000000);
        QAbstractItemViewPrivate::startAutoScroll(&this_00->super_QAbstractItemViewPrivate);
      }
      iVar11 = position.m_i - this_00->firstPos;
      iVar9 = -iVar11;
      if (0 < iVar11) {
        iVar9 = iVar11;
      }
      iVar11 = QApplication::startDragDistance();
      if ((((iVar9 < iVar11) &&
           ((((this_00->sectionIndicator->super_QFrame).super_QWidget.data)->widget_attributes &
            0x10000) != 0)) || (iVar9 = visualIndexAt(this,position.m_i), iVar9 == -1)) ||
         (((iVar9 == 0 && (iVar11 = logicalIndex(this,0), iVar11 == 0)) &&
          (this_00->allowUserMoveOfSection0 != true)))) break;
      iVar12 = QHeaderViewPrivate::headerSectionPosition(this_00,iVar9);
      iVar11 = this_00->headerOffset;
      iVar13 = QHeaderViewPrivate::headerSectionSize(this_00,iVar9);
      bVar8 = QHeaderViewPrivate::reverse(this_00);
      iVar16 = position.m_i;
      if (bVar8) {
        pQVar5 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar16 = ((pQVar5->crect).x2.m_i - ((pQVar5->crect).x1.m_i + position.m_i)) + 1;
      }
      iVar12 = iVar13 / 2 + (iVar12 - iVar11);
      iVar13 = visualIndex(this,this_00->section);
      iVar11 = this_00->target;
      if (iVar9 < iVar13) {
        if (iVar12 <= iVar16) {
          iVar9 = iVar9 + 1;
        }
LAB_004faf0e:
        if ((this_00->logicalIndices).d.size != 0) {
          iVar9 = (this_00->logicalIndices).d.ptr[iVar9];
        }
      }
      else {
        if (iVar13 < iVar9) {
          if (iVar16 <= iVar12) {
            iVar9 = iVar9 + -1;
          }
          goto LAB_004faf0e;
        }
        iVar9 = this_00->section;
      }
      this_00->target = iVar9;
      if ((iVar11 == -1) || (iVar11 != iVar9)) {
        QHeaderViewPrivate::updateSectionsBeforeAfter(this_00,iVar9);
      }
      QHeaderViewPrivate::updateSectionIndicator(this_00,this_00->section,position.m_i);
      break;
    case SelectSections:
      iVar9 = -this_00->headerOffset;
      if (-this_00->headerOffset <= position.m_i) {
        iVar9 = position.m_i;
      }
      iVar9 = logicalIndexAt(this,iVar9);
      if ((0 < position.m_i) && (iVar9 == -1)) {
        iVar9 = QHeaderViewPrivate::lastVisibleVisualIndex(this_00);
        iVar9 = logicalIndex(this,iVar9);
      }
      iVar11 = this_00->pressed;
      if (iVar9 != iVar11) {
        if (iVar11 != -1) {
          updateSection(this,iVar11);
        }
        this_00->pressed = iVar9;
        if ((iVar9 != -1) && (this_00->clickableSections != false)) {
          sectionEntered(this,iVar9);
          updateSection(this,this_00->pressed);
        }
      }
    }
    goto switchD_004faad0_default;
  }
  this_00->state = NoState;
  this_00->firstPressed = -1;
  this_00->pressed = -1;
switchD_004faad0_caseD_0:
  iVar9 = QHeaderViewPrivate::sectionHandleAt(this_00,position.m_i);
  bVar8 = QWidget::testAttribute_helper((QWidget *)this,WA_SetCursor);
  if ((iVar9 != -1) && (RVar10 = sectionResizeMode(this,iVar9), RVar10 == Interactive)) {
    if (!bVar8) {
      QCursor::QCursor((QCursor *)&tip,(this_00->orientation == Horizontal) + SplitVCursor);
      QWidget::setCursor((QWidget *)this,(QCursor *)&tip);
      QCursor::~QCursor((QCursor *)&tip);
    }
    goto switchD_004faad0_default;
  }
  if (bVar8) {
    QWidget::unsetCursor((QWidget *)this);
  }
  iVar9 = logicalIndexAt(this,position.m_i);
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  if (iVar9 == -1) {
    if ((this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip != false) goto LAB_004fac15;
  }
  else {
    pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar3 + 0xa0))(&tip,pQVar3,iVar9,this_00->orientation,4);
    ::QVariant::toString();
    qVar6 = local_a8.size;
    local_88.ptr = local_a8.ptr;
    local_88.d = local_a8.d;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_88.size = local_a8.size;
    local_a8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    ::QVariant::~QVariant((QVariant *)&tip);
    if (((this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip != false) || (qVar6 != 0)) {
LAB_004fac15:
      _tip = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_88);
      pQVar4 = *(QObject **)
                &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.field_0x10;
      if (pQVar4 != (QObject *)0x0) {
        this = (QHeaderView *)pQVar4;
      }
      QCoreApplication::sendEvent((QObject *)this,(QEvent *)&tip);
      (this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip = local_88.size != 0;
      QStatusTipEvent::~QStatusTipEvent(&tip);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
switchD_004faad0_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    const int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    if (pos < 0 && d->state != QHeaderViewPrivate::SelectSections)
        return;
    if (e->buttons() == Qt::NoButton) {
        // Under Cocoa, when the mouse button is released, may include an extra
        // simulated mouse moved event. The state of the buttons when this event
        // is generated is already "no button" and the code below gets executed
        // just before the mouseReleaseEvent and resets the state. This prevents
        // column dragging from working. So this code is disabled under Cocoa.
        d->state = QHeaderViewPrivate::NoState;
        d->firstPressed = d->pressed = -1;
    }
    switch (d->state) {
        case QHeaderViewPrivate::ResizeSection: {
            Q_ASSERT(d->originalSize != -1);
            if (d->cascadingResizing) {
                int delta = d->reverse() ? d->lastPos - pos : pos - d->lastPos;
                int visual = visualIndex(d->section);
                d->cascadingResize(visual, d->headerSectionSize(visual) + delta);
            } else {
                int delta = d->reverse() ? d->firstPos - pos : pos - d->firstPos;
                int newsize = qBound(minimumSectionSize(), d->originalSize + delta, maximumSectionSize());
                resizeSection(d->section, newsize);
            }
            d->lastPos = pos;
            return;
        }
        case QHeaderViewPrivate::MoveSection: {
            if (d->shouldAutoScroll(e->position().toPoint())) {
                d->draggedPosition = e->pos() + d->offset();
                d->startAutoScroll();
            }
            if (qAbs(pos - d->firstPos) >= QApplication::startDragDistance()
#if QT_CONFIG(label)
                || !d->sectionIndicator->isHidden()
#endif
                ) {
                int visual = visualIndexAt(pos);
                if (visual == -1)
                    return;
                if (visual == 0 && logicalIndex(0) == 0 && !d->allowUserMoveOfSection0)
                    return;

                const int posThreshold = d->headerSectionPosition(visual) - d->headerOffset + d->headerSectionSize(visual) / 2;
                const int checkPos = d->reverse() ? d->viewport->width() - pos : pos;
                int moving = visualIndex(d->section);
                int oldTarget = d->target;
                if (visual < moving) {
                    if (checkPos < posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual + 1);
                } else if (visual > moving) {
                    if (checkPos > posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual - 1);
                } else {
                    d->target = d->section;
                }
                if (oldTarget != d->target || oldTarget == -1)
                    d->updateSectionsBeforeAfter(d->target);
                d->updateSectionIndicator(d->section, pos);
            }
            return;
        }
        case QHeaderViewPrivate::SelectSections: {
            int logical = logicalIndexAt(qMax(-d->headerOffset, pos));
            if (logical == -1 && pos > 0)
                logical = logicalIndex(d->lastVisibleVisualIndex());
            if (logical == d->pressed)
                return; // nothing to do
            else if (d->pressed != -1)
                updateSection(d->pressed);
            d->pressed = logical;
            if (d->clickableSections && logical != -1) {
                emit sectionEntered(d->pressed);
                updateSection(d->pressed);
            }
            return;
        }
        case QHeaderViewPrivate::NoState: {
#ifndef QT_NO_CURSOR
            int handle = d->sectionHandleAt(pos);
            bool hasCursor = testAttribute(Qt::WA_SetCursor);
            if (handle != -1 && (sectionResizeMode(handle) == Interactive)) {
                if (!hasCursor)
                    setCursor(d->orientation == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor);
            } else {
                if (hasCursor)
                    unsetCursor();
#ifndef QT_NO_STATUSTIP
                int logical = logicalIndexAt(pos);
                QString statusTip;
                if (logical != -1)
                    statusTip = d->model->headerData(logical, d->orientation, Qt::StatusTipRole).toString();
                if (d->shouldClearStatusTip || !statusTip.isEmpty()) {
                    QStatusTipEvent tip(statusTip);
                    QCoreApplication::sendEvent(d->parent ? d->parent : this, &tip);
                    d->shouldClearStatusTip = !statusTip.isEmpty();
                }
#endif // !QT_NO_STATUSTIP
            }
#endif
            return;
        }
        default:
            break;
    }
}